

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

ChunkIterator * __thiscall absl::lts_20240722::Cord::ChunkIterator::operator++(ChunkIterator *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  anon_class_1_0_00000001 local_19;
  ChunkIterator *local_18;
  ChunkIterator *this_local;
  
  local_18 = this;
  if (this->bytes_remaining_ == 0) {
    operator++::anon_class_1_0_00000001::operator()(&local_19);
  }
  uVar1 = this->bytes_remaining_;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->current_chunk_);
  if (sVar3 <= uVar1) {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->current_chunk_);
    this->bytes_remaining_ = this->bytes_remaining_ - sVar3;
    this_local = this;
    if (this->bytes_remaining_ != 0) {
      bVar2 = cord_internal::CordRepBtreeReader::operator_cast_to_bool(&this->btree_reader_);
      if (bVar2) {
        this_local = AdvanceBtree(this);
      }
      else {
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&this->current_chunk_);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("!current_chunk_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/cord.h"
                        ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30);
        (this->current_chunk_)._M_len = local_30._M_len;
        (this->current_chunk_)._M_str = local_30._M_str;
      }
    }
    return this_local;
  }
  __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/cord.h"
                ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
}

Assistant:

inline Cord::ChunkIterator& Cord::ChunkIterator::operator++() {
  ABSL_HARDENING_ASSERT(bytes_remaining_ > 0 &&
                        "Attempted to iterate past `end()`");
  assert(bytes_remaining_ >= current_chunk_.size());
  bytes_remaining_ -= current_chunk_.size();
  if (bytes_remaining_ > 0) {
    if (btree_reader_) {
      return AdvanceBtree();
    } else {
      assert(!current_chunk_.empty());  // Called on invalid iterator.
    }
    current_chunk_ = {};
  }
  return *this;
}